

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree_navigator.h
# Opt level: O2

CordRep * __thiscall
absl::lts_20240722::cord_internal::CordRepBtreeNavigator::NextUp(CordRepBtreeNavigator *this)

{
  bool bVar1;
  CordRep *pCVar2;
  CordRepBtree *this_00;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  size_t index;
  long lVar6;
  
  if ((ulong)(byte)this->node_[0][0xf] - 1 != (ulong)this->index_[0]) {
    __assert_fail("index_[0] == node_[0]->back()",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/strings/internal/cord_rep_btree_navigator.h"
                  ,0xe4,"CordRep *absl::cord_internal::CordRepBtreeNavigator::NextUp()");
  }
  uVar4 = 0;
  uVar3 = (ulong)(uint)this->height_;
  if (this->height_ < 1) {
    uVar3 = uVar4;
  }
  do {
    uVar5 = uVar4;
    if (uVar3 == uVar5) {
      return (CordRep *)0x0;
    }
    this_00 = this->node_[uVar5 + 1];
    index = (ulong)this->index_[uVar5 + 1] + 1;
    uVar4 = uVar5 + 1;
  } while (index == (byte)this_00[0xf]);
  this->index_[uVar5 + 1] = (uint8_t)index;
  lVar6 = (long)(int)(uVar5 + 1);
  do {
    pCVar2 = CordRepBtree::Edge(this_00,index);
    this_00 = CordRep::btree(pCVar2);
    this->node_[lVar6 + -1] = this_00;
    index = (size_t)(byte)this_00[0xe];
    *(CordRepBtree *)(this->index_ + lVar6 + -1) = this_00[0xe];
    bVar1 = 1 < lVar6;
    lVar6 = lVar6 + -1;
  } while (bVar1);
  pCVar2 = CordRepBtree::Edge(this_00,index);
  return pCVar2;
}

Assistant:

inline CordRep* CordRepBtreeNavigator::NextUp() {
  assert(index_[0] == node_[0]->back());
  CordRepBtree* edge;
  size_t index;
  int height = 0;
  do {
    if (++height > height_) return nullptr;
    edge = node_[height];
    index = index_[height] + 1;
  } while (index == edge->end());
  index_[height] = static_cast<uint8_t>(index);
  do {
    node_[--height] = edge = edge->Edge(index)->btree();
    index_[height] = static_cast<uint8_t>(index = edge->begin());
  } while (height > 0);
  return edge->Edge(index);
}